

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O1

bool __thiscall
Fossilize::StreamArchive::write_entry
          (StreamArchive *this,ResourceTag tag,Hash hash,void *blob,size_t size,
          PayloadWriteFlags flags)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  undefined1 uVar3;
  undefined1 uVar4;
  size_t sVar5;
  int iVar6;
  undefined4 uVar7;
  size_t sVar8;
  mz_ulong mVar9;
  uint8_t *puVar10;
  FILE *__s;
  ulong uVar11;
  undefined1 uVar12;
  __node_base_ptr p_Var13;
  __hash_code __code;
  __node_base_ptr p_Var14;
  PayloadHeaderRaw raw;
  mz_ulong zsize;
  char str [41];
  Hash local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  size_t local_70;
  char local_68 [24];
  char local_50 [32];
  
  if (this->alive != true) {
    return false;
  }
  if (this->mode == ReadOnly) {
    return false;
  }
  uVar1 = this->seen_blobs[tag]._M_h._M_bucket_count;
  uVar11 = hash % uVar1;
  p_Var13 = this->seen_blobs[tag]._M_h._M_buckets[uVar11];
  p_Var14 = (__node_base_ptr)0x0;
  if ((p_Var13 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var13->_M_nxt, p_Var14 = p_Var13,
     p_Var13->_M_nxt[1]._M_nxt != (_Hash_node_base *)hash)) {
    while (p_Var13 = p_Var2, p_Var2 = p_Var13->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var14 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar11) ||
         (p_Var14 = p_Var13, p_Var2[1]._M_nxt == (_Hash_node_base *)hash)) goto LAB_0013fb76;
    }
    p_Var14 = (__node_base_ptr)0x0;
  }
LAB_0013fb76:
  if ((p_Var14 != (__node_base_ptr)0x0) && (p_Var14->_M_nxt != (_Hash_node_base *)0x0)) {
    return true;
  }
  local_90 = hash;
  sprintf(local_68,"%0*x",0x18,tag);
  sprintf(local_50,"%016lx",local_90);
  sVar8 = fwrite(local_68,1,0x28,(FILE *)this->file);
  if (sVar8 != 0x28) {
    return false;
  }
  if ((flags & 1) == 0) {
    uVar3 = (undefined1)(size >> 8);
    uVar4 = (undefined1)(size >> 0x10);
    uVar12 = (undefined1)(size >> 0x18);
    if ((flags & 2) == 0) {
      uVar7 = 0;
      if ((flags & 8) != 0) {
        mVar9 = mz_crc32(0,(mz_uint8 *)blob,size);
        uVar7 = (undefined4)mVar9;
      }
      local_88 = CONCAT44(1,(int)size);
      uStack_80._0_5_ = CONCAT14((char)size,uVar7);
      uStack_80._0_6_ = CONCAT15(uVar3,(undefined5)uStack_80);
      uStack_80._0_7_ = CONCAT16(uVar4,(undefined6)uStack_80);
      uStack_80 = CONCAT17(uVar12,(undefined7)uStack_80);
      sVar8 = fwrite(&local_88,1,0x10,(FILE *)this->file);
      if (sVar8 != 0x10) {
        return false;
      }
      sVar8 = fwrite(blob,1,size,(FILE *)this->file);
      if (sVar8 != size) {
        return false;
      }
      goto LAB_0013fcc9;
    }
    mVar9 = mz_compressBound(size);
    if (this->zlib_buffer_size < mVar9) {
      puVar10 = (uint8_t *)realloc(this->zlib_buffer,mVar9);
      if (puVar10 == (uint8_t *)0x0) {
        free(this->zlib_buffer);
        puVar10 = (uint8_t *)0x0;
        mVar9 = 0;
      }
      this->zlib_buffer = puVar10;
      this->zlib_buffer_size = mVar9;
    }
    if (this->zlib_buffer == (uchar *)0x0) {
      return false;
    }
    local_88 = 0;
    uStack_80 = 0;
    local_70 = this->zlib_buffer_size;
    iVar6 = mz_compress2(this->zlib_buffer,&local_70,(uchar *)blob,size,(flags & 4) * 2 + 1);
    sVar5 = local_70;
    if (iVar6 != 0) {
      return false;
    }
    uVar7 = 0;
    if ((flags & 8) != 0) {
      mVar9 = mz_crc32(0,this->zlib_buffer,local_70);
      uVar7 = (undefined4)mVar9;
    }
    local_88 = CONCAT44(2,(int)sVar5);
    uStack_80._0_5_ = CONCAT14((char)size,uVar7);
    uStack_80._0_6_ = CONCAT15(uVar3,(undefined5)uStack_80);
    uStack_80._0_7_ = CONCAT16(uVar4,(undefined6)uStack_80);
    uStack_80 = CONCAT17(uVar12,(undefined7)uStack_80);
    sVar8 = fwrite(&local_88,1,0x10,(FILE *)this->file);
    if (sVar8 != 0x10) {
      return false;
    }
    blob = this->zlib_buffer;
    size = sVar5 & 0xffffffff;
    __s = (FILE *)this->file;
  }
  else {
    if (size < 0x10) {
      return false;
    }
    __s = (FILE *)this->file;
  }
  sVar8 = fwrite(blob,1,size,__s);
  if (sVar8 != size) {
    return false;
  }
LAB_0013fcc9:
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0;
  std::
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,Fossilize::StreamArchive::Entry>,std::allocator<std::pair<unsigned_long_const,Fossilize::StreamArchive::Entry>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<unsigned_long&,Fossilize::StreamArchive::Entry>
            ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,Fossilize::StreamArchive::Entry>,std::allocator<std::pair<unsigned_long_const,Fossilize::StreamArchive::Entry>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)(this->seen_blobs + tag),&local_90);
  return true;
}

Assistant:

bool write_entry(ResourceTag tag, Hash hash, const void *blob, size_t size, PayloadWriteFlags flags) override
	{
		if (!alive || mode == DatabaseMode::ReadOnly)
			return false;

		auto itr = seen_blobs[tag].find(hash);
		if (itr != end(seen_blobs[tag]))
			return true;

		char str[FOSSILIZE_BLOB_HASH_LENGTH + 1]; // 40 digits + null
		sprintf(str, "%0*x", FOSSILIZE_BLOB_HASH_LENGTH - 16, tag);
		sprintf(str + FOSSILIZE_BLOB_HASH_LENGTH - 16, "%016" PRIx64, hash);

		if (fwrite(str, 1, FOSSILIZE_BLOB_HASH_LENGTH, file) != FOSSILIZE_BLOB_HASH_LENGTH)
			return false;

		if ((flags & PAYLOAD_WRITE_RAW_FOSSILIZE_DB_BIT) != 0)
		{
			// The raw payload already contains the header, so just dump it straight to disk.
			if (size < sizeof(PayloadHeaderRaw))
				return false;
			if (fwrite(blob, 1, size, file) != size)
				return false;
		}
		else if ((flags & PAYLOAD_WRITE_COMPRESS_BIT) != 0)
		{
			auto compressed_bound = mz_compressBound(size);

			if (zlib_buffer_size < compressed_bound)
			{
				auto *new_zlib_buffer = static_cast<uint8_t *>(realloc(zlib_buffer, compressed_bound));
				if (new_zlib_buffer)
				{
					zlib_buffer = new_zlib_buffer;
					zlib_buffer_size = compressed_bound;
				}
				else
				{
					free(zlib_buffer);
					zlib_buffer = nullptr;
					zlib_buffer_size = 0;
				}
			}

			if (!zlib_buffer)
				return false;

			PayloadHeader header = {};
			PayloadHeaderRaw header_raw = {};
			header.uncompressed_size = uint32_t(size);
			header.format = FOSSILIZE_COMPRESSION_DEFLATE;

			mz_ulong zsize = zlib_buffer_size;
			if (mz_compress2(zlib_buffer, &zsize, static_cast<const unsigned char *>(blob), size,
			                 (flags & PAYLOAD_WRITE_BEST_COMPRESSION_BIT) != 0 ? MZ_BEST_COMPRESSION : MZ_BEST_SPEED) != MZ_OK)
				return false;

			header.payload_size = uint32_t(zsize);
			if ((flags & PAYLOAD_WRITE_COMPUTE_CHECKSUM_BIT) != 0)
				header.crc = uint32_t(mz_crc32(MZ_CRC32_INIT, zlib_buffer, zsize));

			convert_to_le(header_raw, header);
			if (fwrite(&header_raw, 1, sizeof(header_raw), file) != sizeof(header_raw))
				return false;

			if (fwrite(zlib_buffer, 1, header.payload_size, file) != header.payload_size)
				return false;
		}
		else
		{
			uint32_t crc = 0;
			if ((flags & PAYLOAD_WRITE_COMPUTE_CHECKSUM_BIT) != 0)
				crc = uint32_t(mz_crc32(MZ_CRC32_INIT, static_cast<const unsigned char *>(blob), size));

			PayloadHeader header = { uint32_t(size), FOSSILIZE_COMPRESSION_NONE, crc, uint32_t(size) };
			PayloadHeaderRaw raw = {};
			convert_to_le(raw, header);

			if (fwrite(&raw, 1, sizeof(raw), file) != sizeof(raw))
				return false;

			if (fwrite(blob, 1, size, file) != size)
				return false;
		}

		// The entry is irrelevant, we're not going to read from this archive any time soon.
		seen_blobs[tag].emplace(hash, Entry{});
		return true;
	}